

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void duckdb::StringVector::AddHeapReference(Vector *vector,Vector *other)

{
  VectorType VVar1;
  bool bVar2;
  Vector *in_RSI;
  shared_ptr<duckdb::VectorBuffer,_true> *in_RDI;
  Vector *unaff_retaddr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffe8;
  
  VVar1 = Vector::GetVectorType(in_RSI);
  if (VVar1 == DICTIONARY_VECTOR) {
    DictionaryVector::Child((Vector *)0x2bd35c0);
    AddHeapReference(in_RSI,(Vector *)in_stack_ffffffffffffffe8._M_pi);
  }
  else {
    bVar2 = shared_ptr<duckdb::VectorBuffer,_true>::operator_bool
                      ((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bd35dd);
    if (bVar2) {
      shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr
                ((shared_ptr<duckdb::VectorBuffer,_true> *)&stack0xffffffffffffffe0,in_RDI);
      AddBuffer(unaff_retaddr,in_RDI);
      shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
                ((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bd361e);
    }
  }
  return;
}

Assistant:

void StringVector::AddHeapReference(Vector &vector, Vector &other) {
	D_ASSERT(vector.GetType().InternalType() == PhysicalType::VARCHAR);
	D_ASSERT(other.GetType().InternalType() == PhysicalType::VARCHAR);

	if (other.GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		StringVector::AddHeapReference(vector, DictionaryVector::Child(other));
		return;
	}
	if (!other.auxiliary) {
		return;
	}
	StringVector::AddBuffer(vector, other.auxiliary);
}